

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

void __thiscall
Clasp::UncoreMinimize::UncoreMinimize(UncoreMinimize *this,SharedMinimizeData *d,OptParams *params)

{
  wsum_t *pwVar1;
  
  MinimizeConstraint::MinimizeConstraint(&this->super_MinimizeConstraint,d);
  (this->super_MinimizeConstraint).super_Constraint._vptr_Constraint =
       (_func_int **)&PTR_propagate_001e8d58;
  this->enum_ = (EnumPtr)0x0;
  pwVar1 = (wsum_t *)operator_new__((ulong)(d->adjust_).ebo_.size << 3);
  this->sum_ = pwVar1;
  (this->todo_).core_.ebo_.buf = (pointer)0x0;
  (this->todo_).core_.ebo_.size = 0;
  (this->todo_).core_.ebo_.cap = 0;
  (this->litData_).ebo_.buf = (pointer)0x0;
  (this->litData_).ebo_.size = 0;
  (this->litData_).ebo_.cap = 0;
  (this->open_).ebo_.buf = (pointer)0x0;
  (this->open_).ebo_.size = 0;
  (this->open_).ebo_.cap = 0;
  (this->closed_).ebo_.buf = (pointer)0x0;
  (this->closed_).ebo_.size = 0;
  (this->closed_).ebo_.cap = 0;
  (this->assume_).ebo_.buf = (pointer)0x0;
  (this->assume_).ebo_.size = 0;
  (this->assume_).ebo_.cap = 0;
  (this->todo_).lits_.ebo_.buf = (pointer)0x0;
  (this->todo_).lits_.ebo_.size = 0;
  (this->todo_).lits_.ebo_.cap = 0;
  (this->todo_).minW_ = 0x7fffffff;
  (this->todo_).last_ = 0;
  (this->todo_).next_ = 0;
  (this->todo_).step_ = 0;
  (this->temp_).lits.ebo_.buf = (pointer)0x0;
  (this->temp_).lits.ebo_.size = 0;
  (this->temp_).lits.ebo_.cap = 0;
  (this->fix_).ebo_.buf = (pointer)0x0;
  (this->fix_).ebo_.size = 0;
  (this->fix_).ebo_.cap = 0;
  (this->conflict_).ebo_.buf = (pointer)0x0;
  (this->conflict_).ebo_.size = 0;
  (this->conflict_).ebo_.cap = 0;
  this->auxInit_ = 0xffffffff;
  this->auxAdd_ = 0;
  this->freeOpen_ = 0;
  this->options_ = *params;
  return;
}

Assistant:

UncoreMinimize::UncoreMinimize(SharedMinimizeData* d, const OptParams& params)
	: MinimizeConstraint(d)
	, enum_(0)
	, sum_(new wsum_t[d->numRules()])
	, auxInit_(UINT32_MAX)
	, auxAdd_(0)
	, freeOpen_(0)
	, options_(params) {
}